

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.c
# Opt level: O3

void cio_eventloop_destroy(cio_eventloop *loop)

{
  uint uVar1;
  uint events;
  
  uVar1 = loop->epoll_fd;
  events = (loop->stop_ev).registered_events & 0xfffffffe;
  (loop->stop_ev).registered_events = events;
  epoll_mod((cio_eventloop *)(ulong)uVar1,&loop->stop_ev,events);
  cio_linux_eventloop_remove(loop,&loop->stop_ev);
  close((loop->stop_ev).fd);
  close(loop->epoll_fd);
  return;
}

Assistant:

void cio_eventloop_destroy(struct cio_eventloop *loop)
{
	cio_linux_eventloop_unregister_read(loop, &loop->stop_ev);
	cio_linux_eventloop_remove(loop, &loop->stop_ev);
	close(loop->stop_ev.fd);
	close(loop->epoll_fd);
}